

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O0

GLint __thiscall
glcts::ArraysOfArrays::TestCaseBase<glcts::ArraysOfArrays::Interface::ES>::
compile_shader_and_get_compilation_result
          (TestCaseBase<glcts::ArraysOfArrays::Interface::ES> *this,string *tested_snippet,
          TestShaderType tested_shader_type,bool require_gpu_shader5)

{
  byte bVar1;
  int iVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestError *pTVar6;
  undefined8 local_80;
  char *code_ptr;
  undefined4 local_64;
  string local_60 [8];
  string shader_source;
  GLint shader_object_id;
  Functions *gl;
  byte local_25;
  GLint compile_status;
  bool require_gpu_shader5_local;
  string *psStack_20;
  TestShaderType tested_shader_type_local;
  string *tested_snippet_local;
  TestCaseBase<glcts::ArraysOfArrays::Interface::ES> *this_local;
  long lVar5;
  
  gl._4_4_ = 1;
  local_25 = require_gpu_shader5;
  compile_status = tested_shader_type;
  psStack_20 = tested_snippet;
  tested_snippet_local = (string *)this;
  pRVar4 = deqp::Context::getRenderContext(this->context_id);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  shader_source.field_2._12_4_ = 0;
  std::__cxx11::string::string(local_60);
  bVar1 = std::__cxx11::string::empty();
  if ((bVar1 & 1) != 1) {
    if ((local_25 & 1) == 0) {
      std::__cxx11::string::operator=(local_60,Interface::ES::shader_version);
    }
    else {
      std::__cxx11::string::operator=(local_60,Interface::ES::shader_version_gpu5);
    }
    switch(compile_status) {
    case 0:
      break;
    case 1:
      break;
    case 2:
      std::__cxx11::string::operator+=
                (local_60,compile_shader_and_get_compilation_result::preamble_cs);
      break;
    case 3:
      std::__cxx11::string::operator+=
                (local_60,compile_shader_and_get_compilation_result::preamble_gs);
      break;
    case 4:
      std::__cxx11::string::operator+=
                (local_60,compile_shader_and_get_compilation_result::preamble_tcs);
      break;
    case 5:
      std::__cxx11::string::operator+=
                (local_60,compile_shader_and_get_compilation_result::preamble_tes);
      break;
    default:
      pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar6,"Unrecognized shader type.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x286);
      __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    std::__cxx11::string::operator+=(local_60,(string *)psStack_20);
    switch(compile_status) {
    case 0:
      shader_source.field_2._12_4_ = (**(code **)(lVar5 + 0x3f0))(0x8b30);
      if (this->fragment_shader_object_id != 0) {
        __assert_fail("0 == fragment_shader_object_id",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                      ,0x29c,
                      "virtual glw::GLint glcts::ArraysOfArrays::TestCaseBase<glcts::ArraysOfArrays::Interface::ES>::compile_shader_and_get_compilation_result(const std::string &, TestShaderType, bool) [API = glcts::ArraysOfArrays::Interface::ES]"
                     );
      }
      this->fragment_shader_object_id = shader_source.field_2._12_4_;
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"Could not create a fragment shader.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                      ,0x29f);
      break;
    case 1:
      shader_source.field_2._12_4_ = (**(code **)(lVar5 + 0x3f0))(0x8b31);
      if (this->vertex_shader_object_id != 0) {
        __assert_fail("0 == vertex_shader_object_id",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                      ,0x292,
                      "virtual glw::GLint glcts::ArraysOfArrays::TestCaseBase<glcts::ArraysOfArrays::Interface::ES>::compile_shader_and_get_compilation_result(const std::string &, TestShaderType, bool) [API = glcts::ArraysOfArrays::Interface::ES]"
                     );
      }
      this->vertex_shader_object_id = shader_source.field_2._12_4_;
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"Could not create a vertex shader.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                      ,0x295);
      break;
    case 2:
      shader_source.field_2._12_4_ = (**(code **)(lVar5 + 0x3f0))(0x91b9);
      if (this->compute_shader_object_id != 0) {
        __assert_fail("0 == compute_shader_object_id",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                      ,0x2a6,
                      "virtual glw::GLint glcts::ArraysOfArrays::TestCaseBase<glcts::ArraysOfArrays::Interface::ES>::compile_shader_and_get_compilation_result(const std::string &, TestShaderType, bool) [API = glcts::ArraysOfArrays::Interface::ES]"
                     );
      }
      this->compute_shader_object_id = shader_source.field_2._12_4_;
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"Could not create a compute shader.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                      ,0x2a9);
      break;
    case 3:
      shader_source.field_2._12_4_ = (**(code **)(lVar5 + 0x3f0))(0x8dd9);
      if (this->geometry_shader_object_id != 0) {
        __assert_fail("0 == geometry_shader_object_id",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                      ,0x2b0,
                      "virtual glw::GLint glcts::ArraysOfArrays::TestCaseBase<glcts::ArraysOfArrays::Interface::ES>::compile_shader_and_get_compilation_result(const std::string &, TestShaderType, bool) [API = glcts::ArraysOfArrays::Interface::ES]"
                     );
      }
      this->geometry_shader_object_id = shader_source.field_2._12_4_;
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"Could not create a geometry shader.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                      ,0x2b3);
      break;
    case 4:
      shader_source.field_2._12_4_ = (**(code **)(lVar5 + 0x3f0))(0x8e88);
      if (this->tess_ctrl_shader_object_id != 0) {
        __assert_fail("0 == tess_ctrl_shader_object_id",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                      ,0x2ba,
                      "virtual glw::GLint glcts::ArraysOfArrays::TestCaseBase<glcts::ArraysOfArrays::Interface::ES>::compile_shader_and_get_compilation_result(const std::string &, TestShaderType, bool) [API = glcts::ArraysOfArrays::Interface::ES]"
                     );
      }
      this->tess_ctrl_shader_object_id = shader_source.field_2._12_4_;
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"Could not create a tesselation control shader.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                      ,0x2bd);
      break;
    case 5:
      shader_source.field_2._12_4_ = (**(code **)(lVar5 + 0x3f0))(0x8e87);
      if (this->tess_eval_shader_object_id != 0) {
        __assert_fail("0 == tess_eval_shader_object_id",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                      ,0x2c4,
                      "virtual glw::GLint glcts::ArraysOfArrays::TestCaseBase<glcts::ArraysOfArrays::Interface::ES>::compile_shader_and_get_compilation_result(const std::string &, TestShaderType, bool) [API = glcts::ArraysOfArrays::Interface::ES]"
                     );
      }
      this->tess_eval_shader_object_id = shader_source.field_2._12_4_;
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"Could not create a tesselation evaluation shader.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                      ,0x2c7);
      break;
    default:
      pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar6,"Unrecognized shader type.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x2cd);
      __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    local_80 = std::__cxx11::string::c_str();
    (**(code **)(lVar5 + 0x12b8))(shader_source.field_2._12_4_,1,&local_80,0);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"glShaderSource() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x2dc);
    (**(code **)(lVar5 + 0x248))(shader_source.field_2._12_4_);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"glCompileShader() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x2e0);
    (**(code **)(lVar5 + 0xa70))(shader_source.field_2._12_4_,0x8b81,(long)&gl + 4);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"glGetShaderiv() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x2e4);
  }
  local_64 = 1;
  this_local._4_4_ = gl._4_4_;
  std::__cxx11::string::~string(local_60);
  return this_local._4_4_;
}

Assistant:

glw::GLint TestCaseBase<API>::compile_shader_and_get_compilation_result(const std::string& tested_snippet,
																		TestShaderType	 tested_shader_type,
																		bool			   require_gpu_shader5)
{
	static const char* preamble_cs = "\n"
									 "layout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
									 "\n";

	static const char* preamble_gs = "\n"
									 "layout(points)                           in;\n"
									 "layout(triangle_strip, max_vertices = 4) out;\n"
									 "\n";

	static const char* preamble_tcs = "\n"
									  "layout(vertices = 1) out;\n"
									  "\n";

	static const char* preamble_tes = "\n"
									  "layout(isolines, point_mode) in;\n"
									  "\n";

	glw::GLint			  compile_status   = GL_TRUE;
	const glw::Functions& gl			   = context_id.getRenderContext().getFunctions();
	glw::GLint			  shader_object_id = 0;

	std::string shader_source;

	if (true == tested_snippet.empty())
	{
		return compile_status;
	}

	if (require_gpu_shader5)
	{
		// Add the version number here, rather than in each individual test
		shader_source = API::shader_version_gpu5;
	}
	else
	{
		// Add the version number here, rather than in each individual test
		shader_source = API::shader_version;
	}

	/* Apply stage specific stuff */
	switch (tested_shader_type)
	{
	case TestCaseBase<API>::VERTEX_SHADER_TYPE:
		break;
	case TestCaseBase<API>::FRAGMENT_SHADER_TYPE:
		break;
	case TestCaseBase<API>::COMPUTE_SHADER_TYPE:
		shader_source += preamble_cs;
		break;
	case TestCaseBase<API>::GEOMETRY_SHADER_TYPE:
		shader_source += preamble_gs;
		break;
	case TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE:
		shader_source += preamble_tcs;
		break;
	case TestCaseBase<API>::TESSELATION_EVALUATION_SHADER_TYPE:
		shader_source += preamble_tes;
		break;
	default:
		TCU_FAIL("Unrecognized shader type.");
		break;
	}

	shader_source += tested_snippet;

	/* Prepare shader object */
	switch (tested_shader_type)
	{
	case TestCaseBase<API>::VERTEX_SHADER_TYPE:
	{
		shader_object_id = gl.createShader(GL_VERTEX_SHADER);
		assert(0 == vertex_shader_object_id);
		vertex_shader_object_id = shader_object_id;

		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create a vertex shader.");

		break;
	} /* case TestCaseBase<API>::VERTEX_SHADER_TYPE: */
	case TestCaseBase<API>::FRAGMENT_SHADER_TYPE:
	{
		shader_object_id = gl.createShader(GL_FRAGMENT_SHADER);
		assert(0 == fragment_shader_object_id);
		fragment_shader_object_id = shader_object_id;

		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create a fragment shader.");

		break;
	} /* case TestCaseBase<API>::FRAGMENT_SHADER_TYPE: */
	case TestCaseBase<API>::COMPUTE_SHADER_TYPE:
	{
		shader_object_id = gl.createShader(GL_COMPUTE_SHADER);
		assert(0 == compute_shader_object_id);
		compute_shader_object_id = shader_object_id;

		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create a compute shader.");

		break;
	} /* case TestCaseBase<API>::COMPUTE_SHADER_TYPE: */
	case TestCaseBase<API>::GEOMETRY_SHADER_TYPE:
	{
		shader_object_id = gl.createShader(GL_GEOMETRY_SHADER);
		assert(0 == geometry_shader_object_id);
		geometry_shader_object_id = shader_object_id;

		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create a geometry shader.");

		break;
	} /* case TestCaseBase<API>::GEOMETRY_SHADER_TYPE: */
	case TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE:
	{
		shader_object_id = gl.createShader(GL_TESS_CONTROL_SHADER);
		assert(0 == tess_ctrl_shader_object_id);
		tess_ctrl_shader_object_id = shader_object_id;

		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create a tesselation control shader.");

		break;
	} /* case TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE: */
	case TestCaseBase<API>::TESSELATION_EVALUATION_SHADER_TYPE:
	{
		shader_object_id = gl.createShader(GL_TESS_EVALUATION_SHADER);
		assert(0 == tess_eval_shader_object_id);
		tess_eval_shader_object_id = shader_object_id;

		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create a tesselation evaluation shader.");

		break;
	} /* case TestCaseBase<API>::TESSELATION_EVALUATION_SHADER_TYPE: */
	default:
	{
		TCU_FAIL("Unrecognized shader type.");

		break;
	} /* default: */
	} /* switch (tested_shader_type) */

	/* Assign source code to the objects */
	const char* code_ptr = shader_source.c_str();

#if IS_DEBUG_DUMP_ALL_SHADERS
	context_id.getTestContext().getLog() << tcu::TestLog::Message << "Compiling: " << tcu::TestLog::EndMessage;
	context_id.getTestContext().getLog() << tcu::TestLog::KernelSource(code_ptr);
#endif /* IS_DEBUG_DUMP_ALL_SHADERS */

	gl.shaderSource(shader_object_id, 1 /* count */, &code_ptr, NULL);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() failed");

	/* Compile the shader */
	gl.compileShader(shader_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() failed");

	/* Get the compilation result. */
	gl.getShaderiv(shader_object_id, GL_COMPILE_STATUS, &compile_status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() failed");

#if IS_DEBUG
	if (GL_TRUE != compile_status)
	{
		glw::GLint  length = 0;
		std::string message;

		/* Error log length */
		gl.getShaderiv(shader_object_id, GL_INFO_LOG_LENGTH, &length);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetShaderiv");

		/* Prepare storage */
		message.resize(length, 0);

		/* Get error log */
		gl.getShaderInfoLog(shader_object_id, length, 0, &message[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetShaderInfoLog");

		context_id.getTestContext().getLog() << tcu::TestLog::Message << "Error message: " << &message[0]
											 << tcu::TestLog::EndMessage;

#if IS_DEBUG_DUMP_ALL_SHADERS
#else  /* IS_DEBUG_DUMP_ALL_SHADERS */
		context_id.getTestContext().getLog() << tcu::TestLog::KernelSource(code_ptr);
#endif /* IS_DEBUG_DUMP_ALL_SHADERS */
	}
#endif /* IS_DEBUG */

	return compile_status;
}